

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaInfo.cpp
# Opt level: O1

DOMElement * __thiscall
xercesc_4_0::SchemaInfo::getTopLevelComponent
          (SchemaInfo *this,unsigned_short compCategory,XMLCh *compName,XMLCh *name)

{
  short sVar1;
  short sVar2;
  XMLCh XVar3;
  MemoryManager *pMVar4;
  XMLSize_t XVar5;
  ValueVectorOf<const_xercesc_4_0::DOMElement_*> *pVVar6;
  ulong uVar7;
  bool bVar8;
  int iVar9;
  DOMNode *parent;
  ulong uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  short *psVar11;
  DOMNode *pDVar12;
  XMLCh *pXVar13;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  XMLSize_t XVar14;
  short *psVar15;
  XMLCh *pXVar16;
  DOMNode *unaff_RBP;
  DOMElement *pDVar17;
  DOMNode *pDVar18;
  ulong uVar19;
  XMLCh XVar20;
  RefHashTableBucketElem<xercesc_4_0::DOMElement> *pRVar21;
  DOMNode *node;
  RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *local_40;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  if ((compCategory < 7 && &this->fSchemaRootElement->super_DOMNode != (DOMNode *)0x0) &&
     (parent = &XUtil::getFirstChildElement(&this->fSchemaRootElement->super_DOMNode)->super_DOMNode
     , parent != (DOMNode *)0x0)) {
    local_40 = this->fTopLevelComponents[compCategory];
    if (local_40 == (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0) {
      local_40 = (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)
                 XMemory::operator_new(0x38,this->fMemoryManager);
      pMVar4 = this->fMemoryManager;
      local_40->fMemoryManager = pMVar4;
      local_40->fAdoptedElems = false;
      local_40->fBucketList = (RefHashTableBucketElem<xercesc_4_0::DOMElement> **)0x0;
      local_40->fHashModulus = 0x11;
      local_40->fInitialModulus = 0x11;
      local_40->fCount = 0;
      iVar9 = (*pMVar4->_vptr_MemoryManager[3])(pMVar4,0x88);
      local_40->fBucketList =
           (RefHashTableBucketElem<xercesc_4_0::DOMElement> **)CONCAT44(extraout_var,iVar9);
      XVar5 = local_40->fHashModulus;
      if (XVar5 != 0) {
        XVar14 = 0;
        do {
          local_40->fBucketList[XVar14] = (RefHashTableBucketElem<xercesc_4_0::DOMElement> *)0x0;
          XVar14 = XVar14 + 1;
        } while (XVar5 != XVar14);
      }
      this->fTopLevelComponents[compCategory] = local_40;
    }
    else {
      if ((name == (XMLCh *)0x0) || (uVar10 = (ulong)(ushort)*name, uVar10 == 0)) {
        uVar10 = 0;
      }
      else {
        XVar20 = name[1];
        if (XVar20 != L'\0') {
          pXVar13 = name + 2;
          do {
            uVar10 = (ulong)(ushort)XVar20 + (uVar10 >> 0x18) + uVar10 * 0x26;
            XVar20 = *pXVar13;
            pXVar13 = pXVar13 + 1;
          } while (XVar20 != L'\0');
        }
        uVar10 = uVar10 % local_40->fHashModulus;
      }
      pRVar21 = local_40->fBucketList[uVar10];
      if (pRVar21 == (RefHashTableBucketElem<xercesc_4_0::DOMElement> *)0x0) {
        pRVar21 = (RefHashTableBucketElem<xercesc_4_0::DOMElement> *)0x0;
      }
      else {
        do {
          bVar8 = StringHasher::equals((StringHasher *)&local_40->field_0x30,name,pRVar21->fKey);
          if (bVar8) goto LAB_0031ed4f;
          pRVar21 = pRVar21->fNext;
        } while (pRVar21 != (RefHashTableBucketElem<xercesc_4_0::DOMElement> *)0x0);
        pRVar21 = (RefHashTableBucketElem<xercesc_4_0::DOMElement> *)0x0;
      }
LAB_0031ed4f:
      if (pRVar21 == (RefHashTableBucketElem<xercesc_4_0::DOMElement> *)0x0) {
        pDVar17 = (DOMElement *)0x0;
      }
      else {
        pDVar17 = pRVar21->fData;
      }
      if (pDVar17 != (DOMElement *)0x0) {
        return pDVar17;
      }
      parent = &this->fLastTopLevelComponent[compCategory]->super_DOMNode;
      unaff_RBP = (DOMNode *)0x0;
    }
    iVar9 = (*((DOMNode *)&parent->_vptr_DOMNode)->_vptr_DOMNode[5])(parent);
    pDVar12 = (DOMNode *)CONCAT44(extraout_var_00,iVar9);
    iVar9 = (*pDVar12->_vptr_DOMNode[0x18])(pDVar12);
    psVar11 = (short *)CONCAT44(extraout_var_01,iVar9);
    node = pDVar12;
    if (psVar11 != &SchemaSymbols::fgELT_REDEFINE) {
      psVar15 = &SchemaSymbols::fgELT_REDEFINE;
      if (psVar11 == (short *)0x0) {
LAB_0031edc4:
        node = (DOMNode *)0x0;
        if (*psVar15 == 0) {
          node = pDVar12;
        }
      }
      else {
        do {
          sVar1 = *psVar11;
          if (sVar1 == 0) goto LAB_0031edc4;
          psVar11 = psVar11 + 1;
          sVar2 = *psVar15;
          psVar15 = psVar15 + 1;
        } while (sVar1 == sVar2);
        node = (DOMNode *)0x0;
      }
    }
    do {
      this->fLastTopLevelComponent[compCategory] = (DOMElement *)parent;
      iVar9 = (*parent->_vptr_DOMNode[0x18])(parent);
      pXVar13 = (XMLCh *)CONCAT44(extraout_var_04,iVar9);
      if (pXVar13 == compName) {
LAB_0031f068:
        iVar9 = (*parent->_vptr_DOMNode[0x29])(parent,SchemaSymbols::fgATT_NAME);
        pXVar13 = (XMLCh *)CONCAT44(extraout_var_05,iVar9);
        RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher>::put
                  (local_40,pXVar13,(DOMElement *)parent);
        bVar8 = true;
        if (pXVar13 != name) {
          pXVar16 = name;
          if ((name == (XMLCh *)0x0) || (pXVar13 == (XMLCh *)0x0)) {
            if (pXVar13 == (XMLCh *)0x0) {
              if (name != (XMLCh *)0x0) goto LAB_0031f13e;
            }
            else {
              bVar8 = *pXVar13 == L'\0';
              if ((name != (XMLCh *)0x0) && (*pXVar13 == L'\0')) {
LAB_0031f13e:
                bVar8 = *pXVar16 == L'\0';
              }
            }
          }
          else {
            do {
              XVar20 = *pXVar13;
              if (XVar20 == L'\0') goto LAB_0031f13e;
              pXVar13 = pXVar13 + 1;
              XVar3 = *pXVar16;
              pXVar16 = pXVar16 + 1;
            } while (XVar20 == XVar3);
            bVar8 = false;
          }
        }
        if (bVar8) {
          return (DOMElement *)parent;
        }
      }
      else {
        pXVar16 = compName;
        if ((compName == (XMLCh *)0x0) || (pXVar13 == (XMLCh *)0x0)) {
          if (pXVar13 == (XMLCh *)0x0) {
            if (compName == (XMLCh *)0x0) goto LAB_0031f068;
LAB_0031f05d:
            bVar8 = *pXVar16 == L'\0';
          }
          else {
            bVar8 = *pXVar13 == L'\0';
            if ((compName != (XMLCh *)0x0) && (*pXVar13 == L'\0')) goto LAB_0031f05d;
          }
          if (bVar8) goto LAB_0031f068;
        }
        else {
          do {
            XVar20 = *pXVar13;
            if (XVar20 == L'\0') goto LAB_0031f05d;
            pXVar13 = pXVar13 + 1;
            XVar3 = *pXVar16;
            pXVar16 = pXVar16 + 1;
          } while (XVar20 == XVar3);
        }
        iVar9 = (*parent->_vptr_DOMNode[0x18])(parent);
        psVar11 = (short *)CONCAT44(extraout_var_06,iVar9);
        if (psVar11 == &SchemaSymbols::fgELT_REDEFINE) {
LAB_0031ede6:
          pVVar6 = this->fFailedRedefineList;
          if (pVVar6 != (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0) {
            uVar10 = pVVar6->fCurCount;
            bVar8 = uVar10 != 0;
            if (bVar8) {
              if (&(*pVVar6->fElemList)->super_DOMNode == parent) goto LAB_0031f14d;
              uVar7 = 1;
              do {
                uVar19 = uVar7;
                if (uVar10 == uVar19) break;
                uVar7 = uVar19 + 1;
              } while (&pVVar6->fElemList[uVar19]->super_DOMNode != parent);
              bVar8 = uVar19 < uVar10;
            }
            if (bVar8) goto LAB_0031f14d;
          }
          for (pDVar12 = &XUtil::getFirstChildElement(parent)->super_DOMNode; pDVar18 = unaff_RBP,
              pDVar12 != (DOMNode *)0x0;
              pDVar12 = &XUtil::getNextSiblingElement(pDVar12)->super_DOMNode) {
            this->fLastTopLevelComponent[compCategory] = (DOMElement *)pDVar12;
            pVVar6 = this->fFailedRedefineList;
            if (pVVar6 == (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0) {
LAB_0031ee9e:
              iVar9 = (*pDVar12->_vptr_DOMNode[0x18])(pDVar12);
              pXVar13 = (XMLCh *)CONCAT44(extraout_var_02,iVar9);
              if (pXVar13 != compName) {
                pXVar16 = compName;
                if ((compName != (XMLCh *)0x0) && (pXVar13 != (XMLCh *)0x0)) {
                  do {
                    XVar20 = *pXVar13;
                    if (XVar20 == L'\0') goto LAB_0031eeff;
                    pXVar13 = pXVar13 + 1;
                    XVar3 = *pXVar16;
                    pXVar16 = pXVar16 + 1;
                  } while (XVar20 == XVar3);
                  goto LAB_0031efb2;
                }
                if (pXVar13 == (XMLCh *)0x0) {
                  if (compName == (XMLCh *)0x0) goto LAB_0031ef0e;
LAB_0031eeff:
                  bVar8 = *pXVar16 == L'\0';
                }
                else {
                  bVar8 = *pXVar13 == L'\0';
                  if ((compName != (XMLCh *)0x0) && (*pXVar13 == L'\0')) goto LAB_0031eeff;
                }
                if (!bVar8) goto LAB_0031efb2;
              }
LAB_0031ef0e:
              iVar9 = (*pDVar12->_vptr_DOMNode[0x29])(pDVar12,SchemaSymbols::fgATT_NAME);
              pXVar13 = (XMLCh *)CONCAT44(extraout_var_03,iVar9);
              RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher>::put
                        (local_40,pXVar13,(DOMElement *)pDVar12);
              bVar8 = true;
              if (pXVar13 != name) {
                pXVar16 = name;
                if ((name == (XMLCh *)0x0) || (pXVar13 == (XMLCh *)0x0)) {
                  if (pXVar13 == (XMLCh *)0x0) {
                    if (name != (XMLCh *)0x0) goto LAB_0031efa3;
                  }
                  else {
                    bVar8 = *pXVar13 == L'\0';
                    if ((name != (XMLCh *)0x0) && (*pXVar13 == L'\0')) {
LAB_0031efa3:
                      bVar8 = *pXVar16 == L'\0';
                    }
                  }
                }
                else {
                  do {
                    XVar20 = *pXVar13;
                    if (XVar20 == L'\0') goto LAB_0031efa3;
                    pXVar13 = pXVar13 + 1;
                    XVar3 = *pXVar16;
                    pXVar16 = pXVar16 + 1;
                  } while (XVar20 == XVar3);
                  bVar8 = false;
                }
              }
              pDVar18 = pDVar12;
              if (bVar8) break;
            }
            else {
              uVar10 = pVVar6->fCurCount;
              bVar8 = uVar10 != 0;
              if (uVar10 == 0) {
LAB_0031ee96:
                if (!bVar8) goto LAB_0031ee9e;
              }
              else if (&(*pVVar6->fElemList)->super_DOMNode != pDVar12) {
                uVar7 = 1;
                do {
                  uVar19 = uVar7;
                  if (uVar10 == uVar19) break;
                  uVar7 = uVar19 + 1;
                } while (&pVVar6->fElemList[uVar19]->super_DOMNode != pDVar12);
                bVar8 = uVar19 < uVar10;
                goto LAB_0031ee96;
              }
            }
LAB_0031efb2:
          }
          unaff_RBP = pDVar18;
          if (pDVar12 != (DOMNode *)0x0) {
            return (DOMElement *)pDVar18;
          }
        }
        else {
          psVar15 = &SchemaSymbols::fgELT_REDEFINE;
          if (psVar11 == (short *)0x0) {
LAB_0031eddc:
            if (*psVar15 == 0) goto LAB_0031ede6;
          }
          else {
            psVar15 = &SchemaSymbols::fgELT_REDEFINE;
            do {
              sVar1 = *psVar11;
              if (sVar1 == 0) goto LAB_0031eddc;
              psVar11 = psVar11 + 1;
              sVar2 = *psVar15;
              psVar15 = psVar15 + 1;
            } while (sVar1 == sVar2);
          }
        }
      }
LAB_0031f14d:
      parent = &XUtil::getNextSiblingElement(parent)->super_DOMNode;
      if ((parent == (DOMNode *)0x0) && (node != (DOMNode *)0x0)) {
        parent = &XUtil::getNextSiblingElement(node)->super_DOMNode;
        node = (DOMNode *)0x0;
      }
    } while (parent != (DOMNode *)0x0);
  }
  return (DOMElement *)0x0;
}

Assistant:

DOMElement*
SchemaInfo::getTopLevelComponent(const unsigned short compCategory,
                                 const XMLCh* const compName,
                                 const XMLCh* const name) {

    if (fSchemaRootElement == 0 || compCategory >= C_Count)
      return 0;

    DOMElement* child = XUtil::getFirstChildElement(fSchemaRootElement);

    if (!child)
        return 0;

    RefHashTableOf<DOMElement>* compList = fTopLevelComponents[compCategory];

    if (fTopLevelComponents[compCategory] == 0) {

        compList= new (fMemoryManager) RefHashTableOf<DOMElement>(17, false, fMemoryManager);
        fTopLevelComponents[compCategory] = compList;
    }
    else {
        DOMElement* cachedChild = compList->get(name);
        if(cachedChild)
            return cachedChild;

        child = fLastTopLevelComponent[compCategory];
    }

    DOMElement* redefParent = (DOMElement*) child->getParentNode();

    // Parent is not "redefine"
    if (!XMLString::equals(redefParent->getLocalName(),SchemaSymbols::fgELT_REDEFINE))
        redefParent = 0;

    while (child != 0) {

        fLastTopLevelComponent[compCategory]=child;
        if (XMLString::equals(child->getLocalName(), compName)) {

            const XMLCh* cName=child->getAttribute(SchemaSymbols::fgATT_NAME);
            compList->put((void*)cName, child);

            if (XMLString::equals(cName, name))
                return child;
        }
        else if (XMLString::equals(child->getLocalName(),SchemaSymbols::fgELT_REDEFINE)
                 && (!fFailedRedefineList || !fFailedRedefineList->containsElement(child))) { // if redefine

            DOMElement* redefineChild = XUtil::getFirstChildElement(child);

            while (redefineChild != 0) {

                fLastTopLevelComponent[compCategory]=redefineChild;
                if ((!fFailedRedefineList || !fFailedRedefineList->containsElement(redefineChild))
                    && XMLString::equals(redefineChild->getLocalName(), compName)) {

                    const XMLCh* rName=redefineChild->getAttribute(SchemaSymbols::fgATT_NAME);
                    compList->put((void*)rName, redefineChild);

                    if (XMLString::equals(rName, name))
                        return redefineChild;
                }

                redefineChild = XUtil::getNextSiblingElement(redefineChild);
            }
        }

        child = XUtil::getNextSiblingElement(child);

        if (child == 0 && redefParent) {

            child = XUtil::getNextSiblingElement(redefParent);
            redefParent = 0;
        }
    }

    return child;
}